

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

FederateState * __thiscall
helics::CommonCore::getHandleFederateCore(CommonCore *this,InterfaceHandle handle)

{
  LocalFederateId LVar1;
  FederateState *pFVar2;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_pm = &(this->handles).m_mutex;
  local_28._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(local_28._M_pm)->_M_impl);
  LVar1 = HandleManager::getLocalFedID(&(this->handles).m_obj,handle);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  if (LVar1.fid == -2000000000) {
    pFVar2 = (FederateState *)0x0;
  }
  else {
    pFVar2 = *(FederateState **)
              ((long)&(this->loopFederates).dataStorage.dataptr[(ulong)(long)LVar1.fid >> 5]->fed +
              (ulong)((LVar1.fid & 0x1fU) << 4));
  }
  return pFVar2;
}

Assistant:

FederateState* CommonCore::getHandleFederateCore(InterfaceHandle handle)
{
    auto local_fed_id = handles.read([handle](auto& hand) { return hand.getLocalFedID(handle); });
    if (local_fed_id.isValid()) {
        return loopFederates[local_fed_id.baseValue()].fed;
    }

    return nullptr;
}